

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::anon_unknown_0::TryConvertFacevaryingToVertexInt<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *src,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  mapped_type mVar1;
  pointer puVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  __node_base _Var5;
  ulong uVar6;
  uint uVar7;
  size_type __new_size;
  bool bVar8;
  bool bVar9;
  uint32_t vidx;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  vdata;
  uint local_7c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if ((dst == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) ||
     (uVar6 = (long)(faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(faceVertexIndices->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start,
     uVar6 < 9 ||
     (long)(src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(src->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start != uVar6)) {
    bVar9 = false;
  }
  else {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    bVar9 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
            _M_impl.super__Vector_impl_data._M_finish == puVar2;
    if (bVar9) {
      __new_size = 1;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      local_78 = src;
      local_70 = dst;
      do {
        local_7c = puVar2[uVar6];
        if (uVar7 < local_7c) {
          uVar7 = local_7c;
        }
        sVar3 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&local_68,&local_7c);
        if (sVar3 == 0) {
          mVar1 = (local_78->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar6];
          pmVar4 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_7c);
          *pmVar4 = mVar1;
        }
        else {
          pmVar4 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_7c);
          if (*pmVar4 !=
              (local_78->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6]) goto LAB_00388bfe;
        }
        uVar6 = uVar6 + 1;
        puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar8 = uVar6 < (ulong)((long)(faceVertexIndices->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >>
                               2);
        bVar9 = !bVar8;
      } while (bVar8);
      __new_size = (size_type)(uVar7 + 1);
      dst = local_70;
    }
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(dst,__new_size);
    memset((dst->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start,0,__new_size << 2);
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      puVar2 = (dst->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var5._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        puVar2[*(uint *)&_Var5._M_nxt[1]._M_nxt] = *(uint *)((long)&_Var5._M_nxt[1]._M_nxt + 4);
        _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
      } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
    }
LAB_00388bfe:
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  return bVar9;
}

Assistant:

bool TryConvertFacevaryingToVertexInt(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices) {
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i])) {
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}